

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCharDataInternal(xmlParserCtxtPtr ctxt,int partial)

{
  xmlChar *pxVar1;
  int iVar2;
  bool bVar3;
  xmlChar *tmp_1;
  xmlChar *tmp;
  int ccol;
  int col;
  int line;
  int nbchar;
  xmlChar *in;
  int partial_local;
  xmlParserCtxtPtr ctxt_local;
  
  ccol = ctxt->input->line;
  tmp._4_4_ = ctxt->input->col;
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  _line = ctxt->input->cur;
  do {
    while( true ) {
      while (*_line == 0x20) {
        _line = _line + 1;
        ctxt->input->col = ctxt->input->col + 1;
      }
      if (*_line != 10) break;
      do {
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
        _line = _line + 1;
      } while (*_line == 10);
    }
    if (*_line == 0x3c) {
      iVar2 = (int)_line - (int)ctxt->input->cur;
      if (iVar2 < 1) {
        return;
      }
      pxVar1 = ctxt->input->cur;
      ctxt->input->cur = _line;
      xmlCharacters(ctxt,pxVar1,iVar2);
      return;
    }
    while( true ) {
      while( true ) {
        tmp._0_4_ = ctxt->input->col;
        while (""[*_line] != '\0') {
          _line = _line + 1;
          tmp._0_4_ = (int)tmp + 1;
        }
        ctxt->input->col = (int)tmp;
        if (*_line != 10) break;
        do {
          ctxt->input->line = ctxt->input->line + 1;
          ctxt->input->col = 1;
          _line = _line + 1;
        } while (*_line == 10);
      }
      if (*_line != 0x5d) break;
      if ((_line[1] == 0x5d) && (_line[2] == 0x3e)) {
        xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
        ctxt->input->cur = _line + 1;
        return;
      }
      if ((partial != 0) && ((long)ctxt->input->end - (long)_line < 2)) break;
      _line = _line + 1;
      ctxt->input->col = ctxt->input->col + 1;
    }
    iVar2 = (int)_line - (int)ctxt->input->cur;
    if (0 < iVar2) {
      pxVar1 = ctxt->input->cur;
      ctxt->input->cur = _line;
      xmlCharacters(ctxt,pxVar1,iVar2);
      ccol = ctxt->input->line;
      tmp._4_4_ = ctxt->input->col;
    }
    ctxt->input->cur = _line;
    if ((*_line == 0xd) && (_line[1] == 10)) {
      ctxt->input->cur = _line + 1;
      _line = _line + 2;
      ctxt->input->line = ctxt->input->line + 1;
      ctxt->input->col = 1;
    }
    else {
      if (*_line == 0x3c) {
        return;
      }
      if (*_line == 0x26) {
        return;
      }
      if (((partial != 0) && (*_line == 0x5d)) && ((long)ctxt->input->end - (long)_line < 2)) {
        return;
      }
      if ((ctxt->input->flags & 0x40U) == 0) {
        xmlParserShrink(ctxt);
      }
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      _line = ctxt->input->cur;
    }
    if (((*_line < 0x20) || (bVar3 = true, 0x7f < *_line)) && (bVar3 = true, *_line != 9)) {
      bVar3 = *_line == 10;
    }
    if (!bVar3) {
      ctxt->input->line = ccol;
      ctxt->input->col = tmp._4_4_;
      xmlParseCharDataComplex(ctxt,partial);
      return;
    }
  } while( true );
}

Assistant:

static void
xmlParseCharDataInternal(xmlParserCtxtPtr ctxt, int partial) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;

    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
get_more_space:
        while (*in == 0x20) { in++; ctxt->input->col++; }
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more_space;
        }
        if (*in == '<') {
            nbchar = in - ctxt->input->cur;
            if (nbchar > 0) {
                const xmlChar *tmp = ctxt->input->cur;
                ctxt->input->cur = in;

                xmlCharacters(ctxt, tmp, nbchar);
            }
            return;
        }

get_more:
        ccol = ctxt->input->col;
        while (test_char_data[*in]) {
            in++;
            ccol++;
        }
        ctxt->input->col = ccol;
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more;
        }
        if (*in == ']') {
            if ((in[1] == ']') && (in[2] == '>')) {
                xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
                ctxt->input->cur = in + 1;
                return;
            }
            if ((!partial) || (ctxt->input->end - in >= 2)) {
                in++;
                ctxt->input->col++;
                goto get_more;
            }
        }
        nbchar = in - ctxt->input->cur;
        if (nbchar > 0) {
            const xmlChar *tmp = ctxt->input->cur;
            ctxt->input->cur = in;

            xmlCharacters(ctxt, tmp, nbchar);

            line = ctxt->input->line;
            col = ctxt->input->col;
        }
        ctxt->input->cur = in;
        if (*in == 0xD) {
            in++;
            if (*in == 0xA) {
                ctxt->input->cur = in;
                in++;
                ctxt->input->line++; ctxt->input->col = 1;
                continue; /* while */
            }
            in--;
        }
        if (*in == '<') {
            return;
        }
        if (*in == '&') {
            return;
        }
        if ((partial) && (*in == ']') && (ctxt->input->end - in < 2)) {
            return;
        }
        SHRINK;
        GROW;
        in = ctxt->input->cur;
    } while (((*in >= 0x20) && (*in <= 0x7F)) ||
             (*in == 0x09) || (*in == 0x0a));
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, partial);
}